

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_disasm.cpp
# Opt level: O2

bool __thiscall
DisasmReplayer::enqueue_create_sampler
          (DisasmReplayer *this,Hash hash,VkSamplerCreateInfo *create_info,VkSampler *sampler)

{
  VkResult VVar1;
  VkSamplerCreateInfo *create_info_local;
  
  create_info_local = create_info;
  if (this->device == (VulkanDevice *)0x0) {
    *sampler = (VkSampler)hash;
  }
  else {
    fprintf(_stderr,"Fossilize INFO: Creating sampler %0lX\n");
    fflush(_stderr);
    VVar1 = Fossilize::VulkanDevice::create_sampler_with_ycbcr_remap
                      (this->device,create_info,sampler);
    if (VVar1 != VK_SUCCESS) {
      fwrite("Fossilize ERROR:  ... Failed!\n",0x1e,1,_stderr);
      fflush(_stderr);
      return false;
    }
    fwrite("Fossilize INFO:  ... Succeeded!\n",0x20,1,_stderr);
    fflush(_stderr);
  }
  std::vector<VkSampler_T_*,_std::allocator<VkSampler_T_*>_>::push_back(&this->samplers,sampler);
  std::vector<const_VkSamplerCreateInfo_*,_std::allocator<const_VkSamplerCreateInfo_*>_>::push_back
            (&this->sampler_infos,&create_info_local);
  return true;
}

Assistant:

bool enqueue_create_sampler(Hash hash, const VkSamplerCreateInfo *create_info, VkSampler *sampler) override
	{
		if (device)
		{
			LOGI("Creating sampler %0" PRIX64 "\n", hash);
			if (device->create_sampler_with_ycbcr_remap(create_info, sampler) != VK_SUCCESS)
			{
				LOGE(" ... Failed!\n");
				return false;
			}
			LOGI(" ... Succeeded!\n");
		}
		else
			*sampler = fake_handle<VkSampler>(hash);

		samplers.push_back(*sampler);
		sampler_infos.push_back(create_info);
		return true;
	}